

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-ops.impl.hpp
# Opt level: O2

Mat * pobr::imgProcessing::utils::matrixOps::
      applyKernel<cv::Vec<unsigned_char,3>,std::array<double,3ul>,double>
                (Mat *img,Mat *kernel,array<double,_3UL> accumulatorInit,
                function<std::array<double,_3UL>_(const_unsigned_long_&,_const_unsigned_long_&,_std::array<double,_3UL>_&,_const_cv::Vec<unsigned_char,_3>_&,_const_double_&)>
                *reducer,function<void_(const_unsigned_long_&,_const_unsigned_long_&,_std::array<double,_3UL>_&,_cv::Vec<unsigned_char,_3>_&,_const_cv::Mat_&)>
                         *applicator)

{
  uint kernelOffsetX;
  uint kernelOffsetY;
  uint endCol;
  uint endRow;
  uint initCol;
  uint initRow;
  function<void_(const_unsigned_long_&,_const_unsigned_long_&)> local_a8;
  anon_class_96_12_04f0a8a3 local_88;
  
  cv::Mat::clone();
  kernelOffsetY = (*(int *)((long)&(reducer->super__Function_base)._M_functor + 8) + -1) / 2;
  local_88.initRow = &initRow;
  kernelOffsetX = (*(int *)((long)&(reducer->super__Function_base)._M_functor + 0xc) + -1) / 2;
  local_88.initCol = &initCol;
  endRow = ~kernelOffsetY + *(int *)(kernel + 8);
  local_88.endRow = &endRow;
  endCol = ~kernelOffsetX + *(int *)(kernel + 0xc);
  local_88.endCol = &endCol;
  local_88.kernelOffsetY = &kernelOffsetY;
  local_88.kernelOffsetX = &kernelOffsetX;
  local_88.accumulatorInit = &accumulatorInit;
  initCol = kernelOffsetX;
  initRow = kernelOffsetY;
  local_88.kernel = (Mat *)reducer;
  local_88.img = kernel;
  local_88.reducer =
       (function<std::array<double,_3UL>_(const_unsigned_long_&,_const_unsigned_long_&,_std::array<double,_3UL>_&,_const_cv::Vec<unsigned_char,_3>_&,_const_double_&)>
        *)applicator;
  local_88.resultImg = img;
  std::function<void(unsigned_long_const&,unsigned_long_const&)>::
  function<pobr::imgProcessing::utils::matrixOps::applyKernel<cv::Vec<unsigned_char,3>,std::array<double,3ul>,double>(cv::Mat_const&,cv::Mat_const&,std::array<double,3ul>,std::function<std::array<double,3ul>(unsigned_long_const&,unsigned_long_const&,std::array<double,3ul>&,cv::Vec<unsigned_char,3>const&,double_const&)>const&,std::function<void(unsigned_long_const&,unsigned_long_const&,std::array<double,3ul>&,cv::Vec<unsigned_char,3>&,cv::Mat_const&)>const&)::_lambda(unsigned_long_const&,unsigned_long_const&)_1_,void>
            ((function<void(unsigned_long_const&,unsigned_long_const&)> *)&local_a8,&local_88);
  forEachPixel(img,&local_a8);
  std::_Function_base::~_Function_base(&local_a8.super__Function_base);
  return img;
}

Assistant:

cv::Mat
matrixOps::applyKernel(
    const cv::Mat& img,
    const cv::Mat& kernel,
    Acc accumulatorInit,
    const std::function<Acc(const uint64_t& x, const uint64_t& y, Acc& accumulator, const PixelClass& pixel, const KernelValue& kernelValue)>& reducer,
    const std::function<void(const uint64_t& x, const uint64_t& y, Acc& accumulator, PixelClass& pixel, const cv::Mat& img)>& applicator
)
{
    // Uses edge cropping
    auto resultImg = img.clone();

    const unsigned int initRow = 0 + ((kernel.rows - 1) / 2);
    const unsigned int initCol = 0 + ((kernel.cols - 1) / 2);

    const unsigned int endRow = (img.rows - 1) - initRow;
    const unsigned int endCol = (img.cols - 1) - initCol;

    const unsigned int kernelOffsetY = 0 + ((kernel.rows - 1) / 2);
    const unsigned int kernelOffsetX = 0 + ((kernel.cols - 1) / 2);

    matrixOps::forEachPixel(
        resultImg,
        [&](const uint64_t& x, const uint64_t& y) -> void
        {
            if (x < initCol) {
                return;
            }
            if (y < initRow) {
                return;
            }
            if (x > endCol) {
                return;
            }
            if (y > endRow) {
                return;
            }

            Acc value = matrixOps::reduceEachPixel<Acc>(
                kernel,
                accumulatorInit,
                [&](const uint64_t& kernelX, const uint64_t& kernelY, Acc& accumulator) -> Acc
                {
                    auto& thisKernelValue = kernel.at<KernelValue>(kernelY, kernelX);
                    auto& adjacentPixel = img.at<PixelClass>(
                        y - kernelOffsetY + kernelY,
                        x - kernelOffsetX + kernelX
                    );

                    return reducer(x, y, accumulator, adjacentPixel, thisKernelValue);
                }
            );

            auto& thisPixel = resultImg.at<PixelClass>(y, x);

            applicator(x, y, value, thisPixel, img);
        }
    );

    return resultImg;
}